

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-profile.c
# Opt level: O2

int luaopen_profile(lua_State *L)

{
  int iVar1;
  lua_CFunction p_Var2;
  long lVar3;
  undefined8 *puVar4;
  char *fmt;
  luaL_Reg *plVar5;
  byte bVar6;
  luaL_Reg l [5];
  
  bVar6 = 0;
  luaL_checkversion_(L,503.0,0x88);
  puVar4 = &DAT_00160c70;
  plVar5 = l;
  for (lVar3 = 10; lVar3 != 0; lVar3 = lVar3 + -1) {
    plVar5->name = *puVar4;
    puVar4 = puVar4 + (ulong)bVar6 * -2 + 1;
    plVar5 = (luaL_Reg *)((long)plVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  lua_createtable(L,0,4);
  lua_createtable(L,0,0);
  lua_createtable(L,0,0);
  lua_createtable(L,0,0);
  lua_pushstring(L,"kv");
  lua_setfield(L,-2,"__mode");
  lua_pushvalue(L,-1);
  lua_setmetatable(L,-3);
  lua_setmetatable(L,-3);
  lua_pushnil(L);
  luaL_setfuncs(L,l,3);
  iVar1 = lua_gettop(L);
  lua_getglobal(L,"coroutine");
  lua_getfield(L,-1,"resume");
  p_Var2 = lua_tocfunction(L,-1);
  if (p_Var2 == (lua_CFunction)0x0) {
    fmt = "Can\'t get coroutine.resume";
  }
  else {
    lua_settop(L,-2);
    lua_getfield(L,iVar1,"resume");
    lua_pushcclosure(L,p_Var2,0);
    lua_setupvalue(L,-2,3);
    lua_settop(L,-2);
    lua_getfield(L,-1,"yield");
    p_Var2 = lua_tocfunction(L,-1);
    if (p_Var2 != (lua_CFunction)0x0) {
      lua_settop(L,-2);
      lua_getfield(L,iVar1,"yield");
      lua_pushcclosure(L,p_Var2,0);
      lua_setupvalue(L,-2,3);
      lua_settop(L,iVar1);
      return 1;
    }
    fmt = "Can\'t get coroutine.yield";
  }
  iVar1 = luaL_error(L,fmt);
  return iVar1;
}

Assistant:

int
luaopen_profile(lua_State *L) {
	luaL_checkversion(L);
	luaL_Reg l[] = {
		{ "start", lstart },
		{ "stop", lstop },
		{ "resume", lresume },
		{ "yield", lyield },
		{ NULL, NULL },
	};
	luaL_newlibtable(L,l);
	lua_newtable(L);	// table thread->start time
	lua_newtable(L);	// table thread->total time

	lua_newtable(L);	// weak table
	lua_pushliteral(L, "kv");
	lua_setfield(L, -2, "__mode");

	lua_pushvalue(L, -1);
	lua_setmetatable(L, -3); 
	lua_setmetatable(L, -3);

	lua_pushnil(L);
	luaL_setfuncs(L,l,3);

	int libtable = lua_gettop(L);

	lua_getglobal(L, "coroutine");
	lua_getfield(L, -1, "resume");

	lua_CFunction co_resume = lua_tocfunction(L, -1);
	if (co_resume == NULL)
		return luaL_error(L, "Can't get coroutine.resume");
	lua_pop(L,1);
	lua_getfield(L, libtable, "resume");
	lua_pushcfunction(L, co_resume);
	lua_setupvalue(L, -2, 3);
	lua_pop(L,1);

	lua_getfield(L, -1, "yield");

	lua_CFunction co_yield = lua_tocfunction(L, -1);
	if (co_yield == NULL)
		return luaL_error(L, "Can't get coroutine.yield");
	lua_pop(L,1);
	lua_getfield(L, libtable, "yield");
	lua_pushcfunction(L, co_yield);
	lua_setupvalue(L, -2, 3);

	lua_settop(L, libtable);

	return 1;
}